

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

Table * luaH_new(lua_State *L)

{
  GCObject *t_00;
  Table *t;
  lua_State *L_local;
  
  t_00 = luaC_newobj(L,5,0x38,(GCObject **)0x0,0);
  (t_00->h).metatable = (Table *)0x0;
  (t_00->h).flags = 0xff;
  (t_00->h).array = (TValue *)0x0;
  (t_00->h).sizearray = 0;
  setnodevector(L,&t_00->h,0);
  return (Table *)t_00;
}

Assistant:

Table *luaH_new (lua_State *L) {
  Table *t = &luaC_newobj(L, LUA_TTABLE, sizeof(Table), NULL, 0)->h;
  t->metatable = NULL;
  t->flags = cast_byte(~0);
  t->array = NULL;
  t->sizearray = 0;
  setnodevector(L, t, 0);
  return t;
}